

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

void __thiscall embree::Texture::~Texture(Texture *this)

{
  pointer pcVar1;
  
  alignedUSMFree(this->data);
  pcVar1 = (this->fileName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->fileName).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Texture::~Texture () {
    alignedUSMFree(data);
  }